

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_xfer_send_shutdown(Curl_easy *data,_Bool *done)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  
  if (((data != (Curl_easy *)0x0) && (pcVar1 = data->conn, pcVar1 != (connectdata *)0x0)) &&
     (pcVar1->writesockfd != -1)) {
    CVar2 = Curl_conn_shutdown(data,(uint)(pcVar1->writesockfd == pcVar1->sock[1]),done);
    return CVar2;
  }
  return CURLE_FAILED_INIT;
}

Assistant:

CURLcode Curl_xfer_send_shutdown(struct Curl_easy *data, bool *done)
{
  int sockindex;

  if(!data || !data->conn)
    return CURLE_FAILED_INIT;
  if(data->conn->writesockfd == CURL_SOCKET_BAD)
    return CURLE_FAILED_INIT;
  sockindex = (data->conn->writesockfd == data->conn->sock[SECONDARYSOCKET]);
  return Curl_conn_shutdown(data, sockindex, done);
}